

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * lws_create_adopt_udp
                (lws_vhost *vhost,char *ads,int port,int flags,char *protocol_name,char *ifname,
                lws *parent_wsi,void *opaque,lws_retry_bo_t *retry_policy)

{
  ushort uVar1;
  uint uVar2;
  int __ecode;
  lws_sock_file_fd_type fd;
  int iVar3;
  lws *plVar4;
  char *pcVar5;
  addrinfo *paVar6;
  uint *puVar7;
  lws *wsi;
  int __protocol;
  undefined4 local_9c;
  ulong local_98;
  ulong local_90;
  char *local_88;
  addrinfo *r;
  char buf [16];
  lws *local_68;
  uchar *puStack_60;
  size_t local_58;
  size_t sStack_50;
  allocated_headers *local_48;
  lws *plStack_40;
  
  local_88 = "null";
  if (ads != (char *)0x0) {
    local_88 = ads;
  }
  _lws_log(8,"%s: %s:%u\n","lws_create_adopt_udp",local_88,(ulong)(uint)port);
  plVar4 = lws_adopt_descriptor_vhost1
                     (vhost,LWS_ADOPT_RAW_SOCKET_UDP,protocol_name,parent_wsi,opaque);
  if (plVar4 == (lws *)0x0) {
    plVar4 = (lws *)0x0;
    _lws_log(1,"%s: udp wsi creation failed\n","lws_create_adopt_udp");
  }
  else {
    *(ulong *)&plVar4->field_0x2dc =
         (ulong)((flags & 4U) << 7) |
         (ulong)((flags & 2U) << 9) |
         *(ulong *)&plVar4->field_0x2dc & 0xffffff7ffffff9ff | (ulong)(flags & 1) << 0x27;
    plVar4->c_port = (uint16_t)port;
    if (retry_policy == (lws_retry_bo_t *)0x0) {
      retry_policy = vhost->retry_policy;
    }
    plVar4->retry_policy = retry_policy;
    local_58 = 0;
    sStack_50 = 0;
    local_48 = (allocated_headers *)0x0;
    plStack_40 = (lws *)0x0;
    puStack_60 = (uchar *)0x1100000002;
    local_68 = (lws *)0x21;
    lws_snprintf(buf,0x10,"%u",(ulong)(uint)port);
    __ecode = getaddrinfo(ads,buf,(addrinfo *)&stack0xffffffffffffff98,(addrinfo **)&r);
    if (__ecode == 0) {
      local_9c = 1;
      if (plVar4->dns_results == (addrinfo *)0x0) {
        plVar4->dns_results = r;
        plVar4->dns_results_next = r;
      }
      if (ads == (char *)0x0 || r != (addrinfo *)0x0) {
        paVar6 = plVar4->dns_results_next;
        if (paVar6 != (addrinfo *)0x0) {
          local_98 = 0x8000000200;
          do {
            if ((plVar4->field_0x2dd & 2) == 0) {
              iVar3 = paVar6->ai_family;
              __protocol = 0x11;
            }
            else {
              iVar3 = 0x11;
              __protocol = 8;
            }
            fd.sockfd = socket(iVar3,2,__protocol);
            if (fd.sockfd != -1) {
              *(uint16_t *)plVar4->dns_results_next->ai_addr->sa_data =
                   plVar4->c_port << 8 | plVar4->c_port >> 8;
              iVar3 = setsockopt(fd.sockfd,1,2,&local_9c,4);
              if (iVar3 < 0) {
                _lws_log(1,"%s: failed to set reuse\n","lws_create_adopt_udp2");
              }
              if (((plVar4->field_0x2dd & 4) != 0) &&
                 (iVar3 = setsockopt(fd.sockfd,1,6,&local_9c,4), iVar3 < 0)) {
                _lws_log(1,"%s: failed to set broadcast\n","lws_create_adopt_udp2");
              }
              if (((*(ulong *)&plVar4->field_0x2dc & 0x8000000000) == 0) ||
                 (iVar3 = bind(fd.sockfd,(sockaddr *)plVar4->dns_results_next->ai_addr,0x10),
                 iVar3 != -1)) {
                if ((*(ulong *)&plVar4->field_0x2dc & local_98) == 0) {
                  iVar3 = connect(fd.sockfd,(sockaddr *)plVar4->dns_results_next->ai_addr,
                                  plVar4->dns_results_next->ai_addrlen);
                  if (iVar3 == -1) {
                    uVar1 = plVar4->dns_results_next->ai_addr->sa_family;
                    local_90 = (ulong)plVar4->c_port;
                    uVar2 = plVar4->dns_results_next->ai_addrlen;
                    puVar7 = (uint *)__errno_location();
                    _lws_log(1,"%s: conn fd %d fam %d %s:%u failed (salen %d) errno %d\n",
                             "lws_create_adopt_udp2",(ulong)(uint)fd.sockfd,(ulong)uVar1,local_88,
                             local_90,(ulong)uVar2,(ulong)*puVar7);
                    close(fd.sockfd);
                    goto LAB_001389ce;
                  }
                  memcpy(plVar4->udp,plVar4->dns_results_next->ai_addr,
                         (ulong)plVar4->dns_results_next->ai_addrlen);
                  plVar4->udp->salen = plVar4->dns_results_next->ai_addrlen;
                }
                lws_addrinfo_clean(plVar4);
                wsi = lws_adopt_descriptor_vhost2(plVar4,LWS_ADOPT_RAW_SOCKET_UDP,fd);
                plVar4 = wsi;
                goto LAB_00138a47;
              }
              _lws_log(1,"%s: bind failed\n","lws_create_adopt_udp2");
            }
LAB_001389ce:
            paVar6 = plVar4->dns_results_next->ai_next;
            plVar4->dns_results_next = paVar6;
          } while (paVar6 != (addrinfo *)0x0);
        }
        puVar7 = (uint *)__errno_location();
        _lws_log(1,"%s: unable to create INET socket %d\n","lws_create_adopt_udp2",(ulong)*puVar7);
        lws_addrinfo_clean(plVar4);
      }
      else {
        _lws_log(4,"%s: bad: n %d, r %p\n","lws_create_adopt_udp2",0);
        plVar4->dns_results = (addrinfo *)0x0;
        plVar4->dns_results_next = (addrinfo *)0x0;
      }
      wsi = (lws *)0x0;
      lws_close_free_wsi(plVar4,LWS_CLOSE_STATUS_NOSTATUS,"adopt udp2 fail");
      plVar4 = wsi;
    }
    else {
      pcVar5 = gai_strerror(__ecode);
      _lws_log(8,"%s: getaddrinfo error: %s\n","lws_create_adopt_udp",pcVar5);
      wsi = plVar4;
      plVar4 = (lws *)&stack0xffffffffffffff98;
    }
LAB_00138a47:
    if (__ecode != 0) {
      plVar4 = (lws *)0x0;
      lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"adopt udp2 fail");
    }
  }
  return plVar4;
}

Assistant:

struct lws *
lws_create_adopt_udp(struct lws_vhost *vhost, const char *ads, int port,
		     int flags, const char *protocol_name, const char *ifname,
		     struct lws *parent_wsi, void *opaque,
		     const lws_retry_bo_t *retry_policy)
{
#if !defined(LWS_PLAT_OPTEE)
	struct lws *wsi;
	int n;

	lwsl_info("%s: %s:%u\n", __func__, ads ? ads : "null", port);

	/* create the logical wsi without any valid fd */

	wsi = lws_adopt_descriptor_vhost1(vhost, LWS_ADOPT_RAW_SOCKET_UDP,
					  protocol_name, parent_wsi, opaque);
	if (!wsi) {
		lwsl_err("%s: udp wsi creation failed\n", __func__);
		goto bail;
	}
	wsi->do_bind = !!(flags & LWS_CAUDP_BIND);
	wsi->do_broadcast = !!(flags & LWS_CAUDP_BROADCAST);
	wsi->pf_packet = !!(flags & LWS_CAUDP_PF_PACKET);
	wsi->c_port = port;
	if (retry_policy)
		wsi->retry_policy = retry_policy;
	else
		wsi->retry_policy = vhost->retry_policy;

#if !defined(LWS_WITH_SYS_ASYNC_DNS)
	{
		struct addrinfo *r, h;
		char buf[16];

		memset(&h, 0, sizeof(h));
		h.ai_family = AF_UNSPEC;    /* Allow IPv4 or IPv6 */
		h.ai_socktype = SOCK_DGRAM;
		h.ai_protocol = IPPROTO_UDP;
		h.ai_flags = AI_PASSIVE;
#ifdef AI_ADDRCONFIG
		h.ai_flags |= AI_ADDRCONFIG;
#endif

		/* if the dns lookup is synchronous, do the whole thing now */
		lws_snprintf(buf, sizeof(buf), "%u", port);
		n = getaddrinfo(ads, buf, &h, &r);
		if (n) {
#if !defined(LWS_PLAT_FREERTOS)
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
				  gai_strerror(n));
#else
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
					strerror(n));
#endif
			//freeaddrinfo(r);
			goto bail1;
		}
		/* complete it immediately after the blocking dns lookup
		 * finished... free r when connect either completed or failed */
		wsi = lws_create_adopt_udp2(wsi, ads, r, 0, NULL);

		return wsi;
	}
#else
	if (ads) {
		/*
		 * with async dns, use the wsi as the point about which to do
		 * the dns lookup and have it call the second part when it's
		 * done.
		 *
		 * Keep a refcount on the results and free it when we connected
		 * or definitively failed.
		 *
		 * Notice wsi has no socket at this point (we don't know what
		 * kind to ask for until we get the dns back).  But it is bound
		 * to a vhost and can be cleaned up from that at vhost destroy.
		 */
		n = lws_async_dns_query(vhost->context, 0, ads,
					LWS_ADNS_RECORD_A,
					lws_create_adopt_udp2, wsi, (void *)ifname);
		lwsl_debug("%s: dns query returned %d\n", __func__, n);
		if (n == LADNS_RET_FAILED) {
			lwsl_err("%s: async dns failed\n", __func__);
			wsi = NULL;
			/*
			 * It was already closed by calling callback with error
			 * from lws_async_dns_query()
			 */
			goto bail;
		}
	} else {
		lwsl_debug("%s: udp adopt has no ads\n", __func__);
		wsi = lws_create_adopt_udp2(wsi, ads, NULL, 0, (void *)ifname);
	}

	/* dns lookup is happening asynchronously */

	lwsl_debug("%s: returning wsi %p\n", __func__, wsi);
	return wsi;
#endif
#if !defined(LWS_WITH_SYS_ASYNC_DNS)
bail1:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "adopt udp2 fail");
	wsi = NULL;
#endif
bail:
	return wsi;
#else
	return NULL;
#endif
}